

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
boost::optional_detail::
optional_base<boost::xpressive::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::assign(optional_base<boost::xpressive::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *this,optional_base<boost::xpressive::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *rhs)

{
  undefined8 uVar1;
  
  if (this->m_initialized != true) {
    if (rhs->m_initialized != false) {
      *(undefined8 *)((long)&(this->m_storage).dummy_ + 0x10) =
           *(undefined8 *)((long)&(rhs->m_storage).dummy_ + 0x10);
      uVar1 = *(undefined8 *)((long)&(rhs->m_storage).dummy_ + 8);
      (this->m_storage).dummy_.aligner_ = (rhs->m_storage).dummy_.aligner_;
      *(undefined8 *)((long)&(this->m_storage).dummy_ + 8) = uVar1;
      this->m_initialized = true;
    }
    return;
  }
  if (rhs->m_initialized != false) {
    (this->m_storage).dummy_.aligner_ = (rhs->m_storage).dummy_.aligner_;
    *(undefined8 *)((long)&(this->m_storage).dummy_ + 8) =
         *(undefined8 *)((long)&(rhs->m_storage).dummy_ + 8);
    (this->m_storage).dummy_.data[0x10] = (rhs->m_storage).dummy_.data[0x10];
    return;
  }
  this->m_initialized = false;
  return;
}

Assistant:

bool is_initialized() const BOOST_NOEXCEPT { return m_initialized ; }